

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint * RDL_giveRCF(RDL_data *data,uint index,char mode)

{
  uint uVar1;
  uint rcf_internal_index;
  uint bcc_index;
  uint uVar2;
  RDL_graph *pRVar3;
  char *edges;
  void *__ptr;
  uint *puVar4;
  RDL_node *pRVar5;
  ulong uVar6;
  int iVar7;
  undefined7 in_register_00000011;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  iVar7 = (int)CONCAT71(in_register_00000011,mode);
  if (iVar7 == 0x62) {
    uVar1 = data->rcf_to_urf[index][0];
    rcf_internal_index = data->rcf_to_urf[index][1];
    bcc_index = data->urf_to_bcc[uVar1][0];
    uVar1 = data->urf_to_bcc[uVar1][1];
    pRVar3 = data->bccGraphs->bcc_graphs[bcc_index];
    uVar2 = pRVar3->E;
    edges = (char *)malloc((ulong)uVar2);
    uVar8 = 0;
    memset(edges,0,(ulong)uVar2);
    __ptr = malloc(0x100);
    RDL_getEdges_internal(data,bcc_index,uVar1,rcf_internal_index,edges);
    if (pRVar3->E != 0) {
      uVar10 = 0x40;
      uVar9 = 0;
      uVar8 = 0;
      do {
        if (edges[uVar9] == '\x01') {
          if (uVar8 == (uint)uVar10) {
            uVar10 = (ulong)((uint)uVar10 * 2);
            __ptr = realloc(__ptr,uVar10 * 4);
          }
          uVar6 = (ulong)uVar8;
          uVar8 = uVar8 + 1;
          *(uint *)((long)__ptr + uVar6 * 4) =
               data->bccGraphs->edge_from_bcc_mapping[bcc_index][uVar9];
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < pRVar3->E);
    }
    puVar4 = (uint *)realloc(__ptr,(ulong)(uVar8 + 1) << 2);
    puVar4[uVar8] = 0xffffffff;
    free(edges);
    return puVar4;
  }
  if (iVar7 == 0x61) {
    pRVar5 = RDL_getNodesRCF(data,index);
    return pRVar5;
  }
  (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_giveRCF()\' with invalid mode \'%c\'\n",
                    (ulong)(uint)(int)mode);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                ,0x2c9,"unsigned int *RDL_giveRCF(const RDL_data *, unsigned int, char)");
}

Assistant:

static unsigned *RDL_giveRCF(const RDL_data *data, unsigned index, char mode)
{
  unsigned *result;
  if(mode == 'a')
  {
    result = RDL_getNodesRCF(data, index);
  }
  else if(mode == 'b')
  {
    result = RDL_getEdgesRCF(data, index);
  }
  else
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_giveRCF()' with invalid mode '%c'\n", mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  return result;
}